

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O1

char * cmd_name(skynet_context *context,char *param)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char acStack_40 [16];
  
  builtin_strncpy(acStack_40,"\x11I\x11",4);
  acStack_40[4] = '\0';
  acStack_40[5] = '\0';
  acStack_40[6] = '\0';
  acStack_40[7] = '\0';
  sVar3 = strlen(param);
  uVar4 = (ulong)((int)sVar3 + 1) + 0xf & 0xfffffffffffffff0;
  lVar1 = -uVar4;
  pcVar7 = acStack_40 + lVar1 + 8;
  lVar2 = -uVar4;
  pcVar6 = pcVar7 + lVar2;
  pcVar5 = (char *)0x0;
  builtin_strncpy(acStack_40 + lVar2 + lVar1,"GI\x11",4);
  pcVar6[-4] = '\0';
  pcVar6[-3] = '\0';
  pcVar6[-2] = '\0';
  pcVar6[-1] = '\0';
  __isoc99_sscanf(param,"%s %s",pcVar7,pcVar6);
  if (*pcVar6 == ':') {
    pcVar5 = (char *)0x0;
    builtin_strncpy(acStack_40 + lVar2 + lVar1,"cI\x11",4);
    pcVar6[-4] = '\0';
    pcVar6[-3] = '\0';
    pcVar6[-2] = '\0';
    pcVar6[-1] = '\0';
    uVar4 = strtoul(pcVar6 + 1,(char **)0x0,0x10);
    if ((uint32_t)uVar4 != 0) {
      if (*pcVar7 == '.') {
        builtin_strncpy(acStack_40 + lVar2 + lVar1,"zI\x11",4);
        pcVar6[-4] = '\0';
        pcVar6[-3] = '\0';
        pcVar6[-2] = '\0';
        pcVar6[-1] = '\0';
        pcVar5 = skynet_handle_namehandle((uint32_t)uVar4,acStack_40 + lVar1 + 9);
      }
      else {
        pcVar5 = (char *)0x0;
        pcVar6[-8] = -0x6a;
        pcVar6[-7] = 'I';
        pcVar6[-6] = '\x11';
        pcVar6[-5] = '\0';
        pcVar6[-4] = '\0';
        pcVar6[-3] = '\0';
        pcVar6[-2] = '\0';
        pcVar6[-1] = '\0';
        skynet_error(context,"Can\'t set global name %s in C",pcVar7);
      }
    }
  }
  return pcVar5;
}

Assistant:

static const char *
cmd_name(struct skynet_context * context, const char * param) {
	int size = strlen(param);
	char name[size+1];
	char handle[size+1];
	sscanf(param,"%s %s",name,handle);
	if (handle[0] != ':') {
		return NULL;
	}
	uint32_t handle_id = strtoul(handle+1, NULL, 16);
	if (handle_id == 0) {
		return NULL;
	}
	if (name[0] == '.') {
		return skynet_handle_namehandle(handle_id, name + 1);
	} else {
		skynet_error(context, "Can't set global name %s in C", name);
	}
	return NULL;
}